

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushPopTest.cpp
# Opt level: O1

void __thiscall
PushPopTest_SortTimeMeasurement_Test::PushPopTest_SortTimeMeasurement_Test
          (PushPopTest_SortTimeMeasurement_Test *this)

{
  allocator<int> local_19;
  
  testing::Test::Test((Test *)this);
  (this->super_PushPopTest).super_TestWithParam<unsigned_long>.super_Test._vptr_Test =
       (_func_int **)&PTR__PushPopTest_00162c78;
  (this->super_PushPopTest).super_TestWithParam<unsigned_long>.
  super_WithParamInterface<unsigned_long>._vptr_WithParamInterface = (_func_int **)&DAT_00162cb8;
  (this->super_PushPopTest)._A = 0x119;
  (this->super_PushPopTest)._C = 0x6efb;
  (this->super_PushPopTest)._M = 0x20d38;
  (this->super_PushPopTest)._X = 0;
  Deque<int,_std::allocator<int>_>::Deque(&(this->super_PushPopTest).myDeque,&local_19);
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            (&(this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>,0);
  (this->super_PushPopTest).super_TestWithParam<unsigned_long>.super_Test._vptr_Test =
       (_func_int **)&PTR__PushPopTest_00162b00;
  (this->super_PushPopTest).super_TestWithParam<unsigned_long>.
  super_WithParamInterface<unsigned_long>._vptr_WithParamInterface =
       (_func_int **)&PTR__PushPopTest_SortTimeMeasurement_Test_00162b40;
  return;
}

Assistant:

TEST_P(PushPopTest, SortTimeMeasurement) {
    std::size_t n = GetParam();

    resetRandom();
    MEASURE_TIME_BEGIN(stdDequeMs);
    for (std::size_t i = 0; i < n; ++i) {
        int x = nextRandom();
        stdDeque.push_back(x);
        int y = nextRandom();
        stdDeque.push_front(y);
    }

    std::sort(stdDeque.begin(), stdDeque.end());
    MEASURE_TIME_END(stdDequeMs);

    resetRandom();
    MEASURE_TIME_BEGIN(myDequeMs);
    for (std::size_t i = 0; i < n; ++i) {
        int x = nextRandom();
        myDeque.push_back(x);
        int y = nextRandom();
        myDeque.push_front(y);
    }

    std::sort(myDeque.begin(), myDeque.end());
    MEASURE_TIME_END(myDequeMs);

    auto p = std::mismatch(myDeque.begin(), myDeque.end(), stdDeque.begin());
    ASSERT_EQ(p.first, myDeque.end());

    std::cout   << "std::deque time: " << stdDequeMs << " ms." << std::endl
                << "My Deque time: " << myDequeMs << " ms." << std::endl;

}